

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

bool __thiscall
double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  double_conversion *pdVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  double *pdVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  DiyFp diy_fp;
  DiyFp cached_power;
  int local_44;
  DiyFp local_40;
  
  pdVar6 = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar8 = (uint)trimmed.start_;
  if (uVar8 != 0) {
    uVar5 = trimmed.length_;
    if (0x135 < (int)(uVar5 + uVar8)) {
      *pdVar6 = INFINITY;
      return true;
    }
    if (-0x144 < (int)(uVar5 + uVar8)) {
      if ((int)uVar8 < 0x10) {
        if (0xffffffe9 < uVar5) {
          if ((int)uVar8 < 1) {
            dVar16 = 0.0;
          }
          else {
            uVar9 = 1;
            uVar11 = 0;
            do {
              uVar11 = ((long)(char)this[uVar9 - 1] + uVar11 * 10) - 0x30;
              if (uVar8 <= uVar9) break;
              uVar9 = uVar9 + 1;
            } while (uVar11 < 0x1999999999999999);
            auVar17._8_4_ = (int)(uVar11 >> 0x20);
            auVar17._0_8_ = uVar11;
            auVar17._12_4_ = 0x45300000;
            dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
          }
          dVar16 = dVar16 / *(double *)(exact_powers_of_ten + (ulong)-uVar5 * 8);
LAB_003edf1f:
          *pdVar6 = dVar16;
          return true;
        }
        if (uVar5 < 0x17) {
          if ((int)uVar8 < 1) {
            dVar16 = 0.0;
          }
          else {
            uVar9 = 1;
            uVar11 = 0;
            do {
              uVar11 = ((long)(char)this[uVar9 - 1] + uVar11 * 10) - 0x30;
              if (uVar8 <= uVar9) break;
              uVar9 = uVar9 + 1;
            } while (uVar11 < 0x1999999999999999);
            auVar18._8_4_ = (int)(uVar11 >> 0x20);
            auVar18._0_8_ = uVar11;
            auVar18._12_4_ = 0x45300000;
            dVar16 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
          }
          dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (ulong)uVar5 * 8);
          goto LAB_003edf1f;
        }
        if (-1 < (int)uVar5) {
          iVar3 = uVar5 - (0xf - uVar8);
          if (iVar3 < 0x17) {
            if ((int)uVar8 < 1) {
              dVar16 = 0.0;
            }
            else {
              uVar9 = 1;
              uVar11 = 0;
              do {
                uVar11 = ((long)(char)this[uVar9 - 1] + uVar11 * 10) - 0x30;
                if (uVar8 <= uVar9) break;
                uVar9 = uVar9 + 1;
              } while (uVar11 < 0x1999999999999999);
              auVar19._8_4_ = (int)(uVar11 >> 0x20);
              auVar19._0_8_ = uVar11;
              auVar19._12_4_ = 0x45300000;
              dVar16 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
            }
            dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (long)(int)(0xf - uVar8) * 8) *
                     *(double *)(exact_powers_of_ten + (long)iVar3 * 8);
            goto LAB_003edf1f;
          }
        }
      }
      uVar9 = 0;
      if ((int)uVar8 < 1) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        uVar9 = 0;
        do {
          pdVar1 = this + uVar11;
          uVar11 = uVar11 + 1;
          uVar9 = ((long)(char)*pdVar1 + uVar9 * 10) - 0x30;
          if (uVar8 <= uVar11) break;
        } while (uVar9 < 0x1999999999999999);
      }
      iVar3 = uVar8 - (int)uVar11;
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        uVar9 = uVar9 + ('4' < (char)this[(int)uVar11]);
      }
      iVar7 = 0;
      if (uVar9 >> 0x36 == 0) {
        iVar7 = 0;
        uVar11 = uVar9;
        do {
          uVar9 = uVar11 << 10;
          iVar7 = iVar7 + -10;
          bVar15 = uVar11 < 0x100000000000;
          uVar11 = uVar9;
        } while (bVar15);
      }
      iVar13 = iVar3 + uVar5;
      for (; -1 < (long)uVar9; uVar9 = uVar9 * 2) {
        iVar7 = iVar7 + -1;
      }
      lVar12 = ((ulong)(iVar3 != 0) << 2) << (-(char)iVar7 & 0x3fU);
      if (-0x15d < iVar13) {
        local_40.f_ = 0;
        local_40.e_ = 0;
        PowersOfTenCache::GetCachedPowerForDecimalExponent(iVar13,&local_40,&local_44);
        iVar13 = iVar13 - local_44;
        if (iVar13 != 0) {
          uVar5 = iVar13 - 1;
          if (6 < uVar5) {
            abort();
          }
          uVar11 = (uVar9 & 0xffffffff) * *(long *)(&DAT_02cc1c98 + (ulong)uVar5 * 8);
          iVar7 = iVar7 + *(int *)(&DAT_02cc1c78 + (ulong)uVar5 * 4);
          uVar9 = ((ulong)((uint)uVar11 & 0x80000000) + 0x80000000 >> 0x20) +
                  (uVar11 >> 0x20) + (uVar9 >> 0x20) * *(long *)(&DAT_02cc1c98 + (ulong)uVar5 * 8);
          if ((int)(0x13 - uVar8) < iVar13) {
            lVar12 = lVar12 + 4;
          }
        }
        uVar10 = (local_40.f_ >> 0x20) * (uVar9 & 0xffffffff);
        uVar11 = (uVar9 >> 0x20) * (local_40.f_ & 0xffffffff);
        uVar5 = local_40.e_ + iVar7 + 0x40;
        uVar11 = ((uVar10 & 0xffffffff) +
                  (uVar11 & 0xffffffff) +
                  ((local_40.f_ & 0xffffffff) * (uVar9 & 0xffffffff) >> 0x20) + 0x80000000 >> 0x20)
                 + (uVar10 >> 0x20) + (uVar11 >> 0x20) + (local_40.f_ >> 0x20) * (uVar9 >> 0x20);
        uVar9 = uVar11;
        uVar8 = uVar5;
        if (uVar11 < 0x40000000000000) {
          do {
            uVar9 = uVar11 << 10;
            uVar8 = uVar8 - 10;
            bVar15 = uVar11 < 0x100000000000;
            uVar11 = uVar9;
          } while (bVar15);
        }
        for (; -1 < (long)uVar9; uVar9 = uVar9 * 2) {
          uVar8 = uVar8 - 1;
        }
        uVar11 = (9 - (ulong)(lVar12 == 0)) + lVar12 << ((char)uVar5 - (char)uVar8 & 0x3fU);
        uVar5 = 0;
        if (-0x472 < (int)uVar8) {
          uVar5 = uVar8 + 0x472;
        }
        uVar10 = 0x35;
        if ((int)uVar8 < -0x43d) {
          uVar10 = (ulong)uVar5;
        }
        iVar3 = (int)uVar10;
        if (iVar3 < 4) {
          bVar4 = (byte)(4 - iVar3);
          uVar9 = uVar9 >> (bVar4 & 0x3f);
          uVar8 = (4 - iVar3) + uVar8;
          uVar10 = (ulong)uVar8;
          uVar11 = (uVar11 >> (bVar4 & 0x3f)) + 9;
          iVar3 = 0x3c;
        }
        else {
          iVar3 = 0x40 - iVar3;
        }
        bVar4 = (byte)iVar3;
        uVar14 = (~(-1L << (bVar4 & 0x3f)) & uVar9) << 3;
        lVar12 = 8L << (bVar4 - 1 & 0x3f);
        diy_fp.f_ = (ulong)(uVar8 + iVar3);
        uVar2 = uVar11 + lVar12;
        diy_fp._8_8_ = uVar10;
        dVar16 = (double)Double::DiyFpToUint64
                                   ((Double *)
                                    (((uVar9 >> (bVar4 & 0x3f)) + 1) - (ulong)(uVar14 < uVar2)),
                                    diy_fp);
        *pdVar6 = dVar16;
        if (lVar12 - uVar11 < uVar14) {
          if (uVar14 < uVar2) {
            return INFINITY <= *pdVar6;
          }
          return true;
        }
        return true;
      }
    }
  }
  *pdVar6 = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}